

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mesh * rf_gen_mesh_knot(rf_mesh *__return_storage_ptr__,float radius,float size,int rad_seg,
                          int sides,rf_allocator allocator,rf_allocator temp_allocator)

{
  long lVar1;
  uint *puVar2;
  par_shapes_mesh *m;
  float *pfVar3;
  long *in_FS_OFFSET;
  rf_mesh *mesh;
  long local_f8;
  rf_int k;
  par_shapes_mesh *knot;
  int sides_local;
  int rad_seg_local;
  float size_local;
  float radius_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  _size_local = allocator.user_data;
  memset(__return_storage_ptr__,0,0x70);
  puVar2 = (uint *)(*(code *)allocator_local.user_data)(&size_local);
  __return_storage_ptr__->vbo_id = puVar2;
  memset(__return_storage_ptr__->vbo_id,0,0x1c);
  if (radius <= 3.0) {
    rad_seg_local = (int)radius;
    if (radius < 0.5) {
      rad_seg_local = 0x3f000000;
    }
  }
  else {
    rad_seg_local = 0x40400000;
  }
  lVar1 = *in_FS_OFFSET;
  *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
  *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
  m = par_shapes_create_trefoil_knot(rad_seg,sides,(float)rad_seg_local);
  par_shapes_scale(m,size,size,size);
  pfVar3 = (float *)(*(code *)allocator_local.user_data)(&size_local,1);
  __return_storage_ptr__->vertices = pfVar3;
  pfVar3 = (float *)(*(code *)allocator_local.user_data)(&size_local,1);
  __return_storage_ptr__->texcoords = pfVar3;
  pfVar3 = (float *)(*(code *)allocator_local.user_data)(&size_local);
  __return_storage_ptr__->normals = pfVar3;
  __return_storage_ptr__->vertex_count = m->ntriangles * 3;
  __return_storage_ptr__->triangle_count = m->ntriangles;
  for (local_f8 = 0; local_f8 < __return_storage_ptr__->vertex_count; local_f8 = local_f8 + 1) {
    __return_storage_ptr__->vertices[local_f8 * 3] =
         m->points[(int)((uint)m->triangles[local_f8] * 3)];
    __return_storage_ptr__->vertices[local_f8 * 3 + 1] =
         m->points[(int)((uint)m->triangles[local_f8] * 3 + 1)];
    __return_storage_ptr__->vertices[local_f8 * 3 + 2] =
         m->points[(int)((uint)m->triangles[local_f8] * 3 + 2)];
    __return_storage_ptr__->normals[local_f8 * 3] =
         m->normals[(int)((uint)m->triangles[local_f8] * 3)];
    __return_storage_ptr__->normals[local_f8 * 3 + 1] =
         m->normals[(int)((uint)m->triangles[local_f8] * 3 + 1)];
    __return_storage_ptr__->normals[local_f8 * 3 + 2] =
         m->normals[(int)((uint)m->triangles[local_f8] * 3 + 2)];
    __return_storage_ptr__->texcoords[local_f8 * 2] =
         m->tcoords[(int)((uint)m->triangles[local_f8] << 1)];
    __return_storage_ptr__->texcoords[local_f8 * 2 + 1] =
         m->tcoords[(int)((uint)m->triangles[local_f8] * 2 + 1)];
  }
  par_shapes_free_mesh(m);
  lVar1 = *in_FS_OFFSET;
  *(undefined8 *)(lVar1 + -0x440) = 0;
  *(undefined8 *)(lVar1 + -0x438) = 0;
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_knot(float radius, float size, int rad_seg, int sides, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    if (radius > 3.0f)      radius = 3.0f;
    else if (radius < 0.5f) radius = 0.5f;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        par_shapes_mesh* knot = par_shapes_create_trefoil_knot(rad_seg, sides, radius);
        par_shapes_scale(knot, size, size, size);

        mesh.vertices  = (float*) RF_ALLOC(allocator, knot->ntriangles * 3 * 3 * sizeof(float));
        mesh.texcoords = (float*) RF_ALLOC(allocator, knot->ntriangles * 3 * 2 * sizeof(float));
        mesh.normals   = (float*) RF_ALLOC(allocator, knot->ntriangles * 3 * 3 * sizeof(float));

        mesh.vertex_count   = knot->ntriangles * 3;
        mesh.triangle_count = knot->ntriangles;

        for (rf_int k = 0; k < mesh.vertex_count; k++)
        {
            mesh.vertices[k * 3    ] = knot->points[knot->triangles[k] * 3    ];
            mesh.vertices[k * 3 + 1] = knot->points[knot->triangles[k] * 3 + 1];
            mesh.vertices[k * 3 + 2] = knot->points[knot->triangles[k] * 3 + 2];

            mesh.normals[k * 3    ] = knot->normals[knot->triangles[k] * 3    ];
            mesh.normals[k * 3 + 1] = knot->normals[knot->triangles[k] * 3 + 1];
            mesh.normals[k * 3 + 2] = knot->normals[knot->triangles[k] * 3 + 2];

            mesh.texcoords[k * 2    ] = knot->tcoords[knot->triangles[k] * 2    ];
            mesh.texcoords[k * 2 + 1] = knot->tcoords[knot->triangles[k] * 2 + 1];
        }

        par_shapes_free_mesh(knot);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}